

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

int __thiscall spectest::JSONParser::ReadChar(JSONParser *this)

{
  value_type vVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  char c;
  JSONParser *this_local;
  
  uVar2 = this->json_offset_;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->json_data_);
  if (uVar2 < sVar3) {
    (this->prev_loc_).filename._M_len = (this->loc_).filename._M_len;
    (this->prev_loc_).filename._M_str = (this->loc_).filename._M_str;
    (this->prev_loc_).field_1.field_1.offset = (this->loc_).field_1.field_1.offset;
    *(undefined8 *)((long)&(this->prev_loc_).field_1 + 8) =
         *(undefined8 *)((long)&(this->loc_).field_1 + 8);
    sVar3 = this->json_offset_;
    this->json_offset_ = sVar3 + 1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->json_data_,sVar3);
    vVar1 = *pvVar4;
    if (vVar1 == '\n') {
      (this->loc_).field_1.field_0.line = (this->loc_).field_1.field_0.line + 1;
      (this->loc_).field_1.field_0.first_column = 1;
    }
    else {
      (this->loc_).field_1.field_0.first_column = (this->loc_).field_1.field_0.first_column + 1;
    }
    this->has_prev_loc_ = true;
    this_local._4_4_ = (int)(char)vVar1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int JSONParser::ReadChar() {
  if (json_offset_ >= json_data_.size()) {
    return -1;
  }
  prev_loc_ = loc_;
  char c = json_data_[json_offset_++];
  if (c == '\n') {
    loc_.line++;
    loc_.first_column = 1;
  } else {
    loc_.first_column++;
  }
  has_prev_loc_ = true;
  return c;
}